

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2Test.cpp
# Opt level: O2

void __thiscall testForceOnSo3::test_method(testForceOnSo3 *this)

{
  VectorXd perturbedRotVec;
  VectorXd randM;
  RandomReturnType local_270;
  shared_count sStack_260;
  char *local_258;
  char *local_250;
  undefined1 local_248 [24];
  scalar_constant_op<double> local_230;
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> local_210 [24];
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  S2 S;
  Point rot;
  
  mnf::S2::S2(&S);
  _rot = 3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&perturbedRotVec,(int *)&rot);
  _rot = 3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&randM,(int *)&rot);
  mnf::Manifold::createRandomPoint(1.0);
  local_258 = (char *)0x3f847ae147ae147b;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Random(&local_270,3);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)local_248,(double *)&local_258,(StorageBaseType *)&local_270);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>const>>
            (&randM,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)local_248);
  mnf::SubPoint::value();
  Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>>::
  operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             *)local_248,
            (MatrixBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>> *)
            &local_270,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&randM);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            (&perturbedRotVec,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)local_248);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            (local_210,
             &perturbedRotVec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (type *)0x0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)local_248,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&perturbedRotVec,(type *)0x0);
  mnf::Manifold::forceOnM(&S,local_210,local_248);
  free((void *)local_230.m_other);
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0x5c);
  local_270.m_rows.m_value._0_1_ = (StorageBaseType)mnf::Manifold::isInM((Matrix *)&S,1e-08);
  local_270._8_8_ = 0;
  sStack_260.pi_ = (sp_counted_base *)0x0;
  local_258 = "S.isInM(perturbedRotVec)";
  local_250 = "";
  local_248[8] = 0;
  local_248._0_8_ = &PTR__lazy_ostream_00137c98;
  local_248._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/S2Test.cpp"
  ;
  local_1f0 = "";
  local_230.m_other = (double)&local_258;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_260);
  mnf::Point::~Point(&rot);
  free(randM.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(perturbedRotVec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  mnf::Manifold::~Manifold((Manifold *)&S);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(testForceOnSo3)
{
  S2 S;
  Eigen::VectorXd perturbedRotVec(3);
  Eigen::VectorXd randM(3);
  Point rot = S.createRandomPoint();
  randM = 0.01 * Eigen::VectorXd::Random(3);
  perturbedRotVec = rot.value() + randM;
  S.forceOnM(perturbedRotVec, perturbedRotVec);
  BOOST_CHECK(S.isInM(perturbedRotVec));
}